

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  test_var_type tVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  size_type *psVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  string shader_source;
  string array_initializers [4];
  string invalid_size_declarations [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  undefined1 *local_330;
  undefined8 local_328;
  undefined1 local_320;
  undefined7 uStack_31f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  long local_2f0;
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES> *local_2e8;
  ulong local_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [8];
  ulong uStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_2e8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"[2][2][2][]","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"[2][2][][2]","");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"[2][][2][2]","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"[][2][2][2]","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"[2][2][][]","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"[2][][2][]","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"[][2][2][]","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"[2][][][2]","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"[][2][][2]","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"[][][2][2]","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[2][][][]","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[][2][][]","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"[][][2][]","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"[][][][2]","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"[][][][]","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,"");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,"");
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,"");
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,"");
  lVar8 = 0;
  while (supported_variable_types_map._16_8_ != 0) {
    tVar1 = test_shader_compilation::var_types_set_es[lVar8];
    lVar9 = 0x21e5b78;
    lVar7 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar7 + 0x20)) {
        lVar9 = lVar7;
      }
      lVar7 = *(long *)(lVar7 + 0x10 + (ulong)(*(int *)(lVar7 + 0x20) < (int)tVar1) * 8);
    } while (lVar7 != 0);
    if ((lVar9 == 0x21e5b78) || ((int)tVar1 < *(int *)(lVar9 + 0x20))) break;
    lVar7 = 8;
    local_2f0 = lVar8;
    do {
      local_330 = &local_320;
      local_328 = 0;
      local_320 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,0x1ad527a);
      std::operator+(&local_310,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar9 + 0x28));
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_310,*(ulong *)((long)&uStack_220 + lVar7));
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      psVar5 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_370.field_2._M_allocated_capacity = *psVar5;
        local_370.field_2._8_8_ = plVar2[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar5;
        local_370._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_370._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_370);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_340 = *plVar6;
        lStack_338 = plVar2[3];
        local_350 = &local_340;
      }
      else {
        local_340 = *plVar6;
        local_350 = (long *)*plVar2;
      }
      local_348 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_350);
      if (local_350 != &local_340) {
        operator_delete(local_350,local_340 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_330);
      std::__cxx11::string::_M_append((char *)&local_330,shader_start_abi_cxx11_);
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_2e0 = (ulong)tested_shader_type;
      puVar3 = &set_tesseation_abi_cxx11_;
      switch(local_2e0) {
      case 1:
        std::__cxx11::string::append((char *)&local_330);
        break;
      case 3:
        puVar3 = &emit_quad_abi_cxx11_;
      case 4:
        std::__cxx11::string::_M_append((char *)&local_330,*puVar3);
      }
      std::__cxx11::string::_M_append((char *)&local_330,shader_end_abi_cxx11_);
      (*(local_2e8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(local_2e8,(ulong)tested_shader_type,&local_330);
      if (local_330 != &local_320) {
        operator_delete(local_330,CONCAT71(uStack_31f,local_320) + 1);
      }
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x1e8);
    lVar8 = local_2f0 + 1;
    if (lVar8 == 3) {
      if (supported_variable_types_map._16_8_ != 0) {
        lVar7 = 0x21e5b78;
        lVar8 = supported_variable_types_map._16_8_;
        do {
          if ((int)TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES <
              *(int *)(lVar8 + 0x20)) {
            lVar7 = lVar8;
          }
          lVar8 = *(long *)(lVar8 + 0x10 +
                           (ulong)(*(int *)(lVar8 + 0x20) <
                                  (int)TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT) * 8);
        } while (lVar8 != 0);
        if ((lVar7 != 0x21e5b78) &&
           (*(int *)(lVar7 + 0x20) <
            (int)TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE)) {
          local_2f0 = 0;
          local_330 = &local_320;
          local_328 = 0;
          local_320 = 0;
          std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,0x1ad527a);
          std::operator+(&local_2b8,"    ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar7 + 0x28));
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2b8,(ulong)local_218._M_dataplus._M_p);
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_310.field_2._M_allocated_capacity = *psVar5;
            local_310.field_2._8_8_ = plVar2[3];
          }
          else {
            local_310.field_2._M_allocated_capacity = *psVar5;
            local_310._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_310._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_370.field_2._M_allocated_capacity = *psVar5;
            local_370.field_2._8_8_ = plVar2[3];
          }
          else {
            local_370.field_2._M_allocated_capacity = *psVar5;
            local_370._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_370._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_298[0]);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_340 = *plVar6;
            lStack_338 = plVar2[3];
            local_350 = &local_340;
          }
          else {
            local_340 = *plVar6;
            local_350 = (long *)*plVar2;
          }
          local_348 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_350);
          if (local_350 != &local_340) {
            operator_delete(local_350,local_340 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar7 + 0x28),&local_218);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_370);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_340 = *plVar6;
            lStack_338 = plVar2[3];
            local_350 = &local_340;
          }
          else {
            local_340 = *plVar6;
            local_350 = (long *)*plVar2;
          }
          local_348 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_298[0]);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_2c8 = *plVar6;
            lStack_2c0 = plVar2[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *plVar6;
            local_2d8 = (long *)*plVar2;
          }
          local_2d0 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8,local_2c8 + 1);
          }
          if (local_350 != &local_340) {
            operator_delete(local_350,local_340 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_330);
          std::__cxx11::string::_M_append((char *)&local_330,shader_start_abi_cxx11_);
          if (tested_shader_type < SHADER_TYPE_LAST) {
            (*(code *)(&DAT_01aca088 + *(int *)(&DAT_01aca088 + local_2e0 * 4)))();
            return;
          }
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1c72);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c7a);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1c52);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}